

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

void __thiscall sptk::reaper::EpochTracker::GetVoiceTransitionFeatures(EpochTracker *this)

{
  pointer pfVar1;
  pointer pfVar2;
  uint uVar3;
  int iVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  uVar3 = (uint)((this->time_span_ * 0.5) / this->internal_frame_interval_ + 0.5);
  uVar7 = 1;
  if (1 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (&this->voice_onset_prob_,(long)this->n_feature_frames_);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->voice_offset_prob_,(long)this->n_feature_frames_);
  iVar4 = this->n_feature_frames_;
  pfVar5 = (this->bandpassed_rms_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (this->voice_onset_prob_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->voice_offset_prob_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = uVar7; (long)uVar6 < (long)(iVar4 - (int)uVar7); uVar6 = uVar6 + 1) {
    fVar9 = (pfVar5[uVar7 * 2] - *pfVar5) / this->level_change_den_;
    fVar8 = 1.0;
    if ((fVar9 <= 1.0) && (fVar8 = -1.0, -1.0 <= fVar9)) {
      fVar8 = fVar9;
    }
    fVar9 = 1.0;
    if ((-1.0 <= fVar8) && (fVar9 = -fVar8, fVar9 < fVar8)) {
      fVar9 = 0.0;
    }
    fVar10 = 0.0;
    if (0.0 <= fVar8) {
      fVar10 = fVar8;
    }
    pfVar1[uVar6] = fVar10;
    pfVar2[uVar6] = fVar9;
    pfVar5 = pfVar5 + 1;
  }
  for (uVar6 = 0; iVar4 = iVar4 + -1, uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pfVar2[uVar6] = 0.0;
    pfVar1[uVar6] = 0.0;
    pfVar2[iVar4] = 0.0;
    pfVar1[iVar4] = 0.0;
  }
  return;
}

Assistant:

void EpochTracker::GetVoiceTransitionFeatures(void) {
  int32_t frame_offset = RoundUp(0.5 * time_span_ / internal_frame_interval_);
  if (frame_offset <= 0) {
    frame_offset = 1;
  }
  voice_onset_prob_.resize(n_feature_frames_);
  voice_offset_prob_.resize(n_feature_frames_);
  int32_t limit = n_feature_frames_ - frame_offset;
  for (int32_t frame = frame_offset; frame < limit; ++frame) {
    float delta_rms = (bandpassed_rms_[frame + frame_offset] -
                       bandpassed_rms_[frame - frame_offset]) / level_change_den_;
    if (delta_rms > 1.0) {
      delta_rms = 1.0;
    } else {
      if (delta_rms < -1.0) {
        delta_rms = -1.0;
      }
    }
    float prob_onset = delta_rms;
    float prob_offset = -prob_onset;
    if (prob_onset > 1.0) {
      prob_onset = 1.0;
    } else {
      if (prob_onset < 0.0) {
        prob_onset = 0.0;
      }
    }
    if (prob_offset > 1.0) {
      prob_offset = 1.0;
    } else {
      if (prob_offset < 0.0) {
        prob_offset = 0.0;
      }
    }
    voice_onset_prob_[frame] = prob_onset;
    voice_offset_prob_[frame] = prob_offset;
  }
  // Just set the onset and offset probs to zero in the end zones.
  for (int32_t frame = 0; frame < frame_offset; ++frame) {
    int32_t bframe = n_feature_frames_ - 1 - frame;
    voice_onset_prob_[frame] = voice_offset_prob_[frame] = 0.0;
    voice_onset_prob_[bframe] = voice_offset_prob_[bframe] = 0.0;
  }
}